

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_version_manager.cpp
# Opt level: O2

vector<duckdb::MetaBlockPointer,_true> * __thiscall
duckdb::RowVersionManager::Checkpoint
          (vector<duckdb::MetaBlockPointer,_true> *__return_storage_ptr__,RowVersionManager *this,
          MetadataManager *manager)

{
  _Head_base<0UL,_duckdb::ChunkInfo_*,_false> __args_1;
  pointer pMVar1;
  ChunkInfo *pCVar2;
  pointer ppVar3;
  int iVar4;
  reference pvVar5;
  pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_> *entry;
  pointer ppVar6;
  vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_true> to_serialize;
  unsigned_long local_90;
  vector<duckdb::MetaBlockPointer,_true> *local_88;
  MetadataWriter writer;
  
  if ((this->has_changes == false) &&
     ((this->storage_pointers).
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->storage_pointers).
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    MetadataManager::ClearModifiedBlocks(manager,&this->storage_pointers);
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>,
               &(this->storage_pointers).
                super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>);
  }
  else {
    to_serialize.
    super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_serialize.
    super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_serialize.
    super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (writer.super_WriteStream._vptr_WriteStream = (_func_int **)0x0;
        writer.super_WriteStream._vptr_WriteStream <
        (_func_int **)
        ((long)(this->vector_info).
               super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->vector_info).
               super_vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3);
        writer.super_WriteStream._vptr_WriteStream = writer.super_WriteStream._vptr_WriteStream + 1)
    {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true>,_true>
               ::get<true>(&this->vector_info,(size_type)writer.super_WriteStream._vptr_WriteStream)
      ;
      __args_1._M_head_impl =
           (pvVar5->super_unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::ChunkInfo_*,_std::default_delete<duckdb::ChunkInfo>_>
           .super__Head_base<0UL,_duckdb::ChunkInfo_*,_false>._M_head_impl;
      if (__args_1._M_head_impl != (ChunkInfo *)0x0) {
        iVar4 = (**(code **)((long)(__args_1._M_head_impl)->_vptr_ChunkInfo + 0x40))
                          (__args_1._M_head_impl);
        if ((char)iVar4 != '\0') {
          ::std::
          vector<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>>>
          ::emplace_back<unsigned_long&,duckdb::ChunkInfo&>
                    ((vector<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<duckdb::ChunkInfo>>>>
                      *)&to_serialize,(unsigned_long *)&writer,__args_1._M_head_impl);
        }
      }
    }
    if (to_serialize.
        super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        to_serialize.
        super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>).
      super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      pMVar1 = (this->storage_pointers).
               super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
               super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->storage_pointers).
          super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
          _M_impl.super__Vector_impl_data._M_finish != pMVar1) {
        (this->storage_pointers).
        super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
        _M_impl.super__Vector_impl_data._M_finish = pMVar1;
      }
      MetadataWriter::MetadataWriter
                (&writer,manager,
                 (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)
                 &this->storage_pointers);
      local_90 = (long)to_serialize.
                       super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                       .
                       super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)to_serialize.
                       super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                       .
                       super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
      local_88 = &this->storage_pointers;
      (**writer.super_WriteStream._vptr_WriteStream)(&writer,&local_90,8);
      ppVar3 = to_serialize.
               super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
               .
               super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar6 = to_serialize.
                    super_vector<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                    .
                    super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1
          ) {
        local_90 = ppVar6->first;
        pCVar2 = (ppVar6->second)._M_data;
        (**writer.super_WriteStream._vptr_WriteStream)(&writer,&local_90,8);
        (*pCVar2->_vptr_ChunkInfo[9])(pCVar2,&writer);
      }
      MetadataWriter::Flush(&writer);
      this->has_changes = false;
      ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::vector
                (&__return_storage_ptr__->
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>,
                 &local_88->
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>)
      ;
      MetadataWriter::~MetadataWriter(&writer);
    }
    ::std::
    _Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
    ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<duckdb::ChunkInfo>_>_>_>
                     *)&to_serialize);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MetaBlockPointer> RowVersionManager::Checkpoint(MetadataManager &manager) {
	if (!has_changes && !storage_pointers.empty()) {
		// the row version manager already exists on disk and no changes were made
		// we can write the current pointer as-is
		// ensure the blocks we are pointing to are not marked as free
		manager.ClearModifiedBlocks(storage_pointers);
		// return the root pointer
		return storage_pointers;
	}
	// first count how many ChunkInfo's we need to deserialize
	vector<pair<idx_t, reference<ChunkInfo>>> to_serialize;
	for (idx_t vector_idx = 0; vector_idx < vector_info.size(); vector_idx++) {
		auto chunk_info = vector_info[vector_idx].get();
		if (!chunk_info) {
			continue;
		}
		if (!chunk_info->HasDeletes()) {
			continue;
		}
		to_serialize.emplace_back(vector_idx, *chunk_info);
	}
	if (to_serialize.empty()) {
		return vector<MetaBlockPointer>();
	}

	storage_pointers.clear();

	MetadataWriter writer(manager, &storage_pointers);
	// now serialize the actual version information
	writer.Write<idx_t>(to_serialize.size());
	for (auto &entry : to_serialize) {
		auto &vector_idx = entry.first;
		auto &chunk_info = entry.second.get();
		writer.Write<idx_t>(vector_idx);
		chunk_info.Write(writer);
	}
	writer.Flush();

	has_changes = false;
	return storage_pointers;
}